

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_line.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_line::ArchiveIN(ChFunctionPosition_line *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_48;
  ChNameValue<std::shared_ptr<chrono::geometry::ChLine>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_line>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  local_30._value = &this->trajectory_line;
  local_30._name = "trajectory_line";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->space_fx;
  local_48._name = "space_fx";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChFunctionPosition_line::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_line>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(trajectory_line);
	marchive >> CHNVP(space_fx);

}